

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_str_finish(sqlite3_str *p)

{
  char *pcVar1;
  
  if (p != &sqlite3OomStr && p != (sqlite3_str *)0x0) {
    pcVar1 = sqlite3StrAccumFinish(p);
    sqlite3_free(p);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

SQLITE_API char *sqlite3_str_finish(sqlite3_str *p){
  char *z;
  if( p!=0 && p!=&sqlite3OomStr ){
    z = sqlite3StrAccumFinish(p);
    sqlite3_free(p);
  }else{
    z = 0;
  }
  return z;
}